

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O2

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avx2
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint uVar13;
  void *pvVar14;
  size_t sVar15;
  size_t sVar16;
  undefined1 auVar17 [16];
  int *piVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  void *pvVar23;
  void *pvVar24;
  void *pvVar25;
  void *pvVar26;
  void *pvVar27;
  void *pvVar28;
  uint *puVar29;
  long lVar30;
  undefined4 uVar31;
  long lVar32;
  void *pvVar33;
  int i;
  long lVar34;
  long lVar35;
  long lVar36;
  void *pvVar37;
  void *pvVar38;
  ulong uVar39;
  void *pvVar40;
  void *pvVar41;
  long lVar42;
  void *pvVar43;
  undefined1 local_a8 [64];
  size_t local_68;
  short asStack_5c [2];
  short tmp [6] [3];
  
  local_68 = 0;
  local_a8._0_8_ = (void *)0x0;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = 0;
  local_a8._16_8_ = 0;
  local_a8._24_4_ = 0;
  local_a8._32_8_ = (Allocator *)0x0;
  local_a8._40_4_ = 0;
  local_a8._44_4_ = 0;
  local_a8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  uVar39 = 0;
  Mat::create((Mat *)local_a8,0x24,inch,outch,2,(Allocator *)0x0);
  uVar20 = 0;
  if (0 < inch) {
    uVar20 = (ulong)(uint)inch;
  }
  uVar21 = 0;
  if (0 < outch) {
    uVar21 = (ulong)(uint)outch;
  }
  for (; uVar39 != uVar21; uVar39 = uVar39 + 1) {
    iVar19 = inch * 9 * (int)uVar39;
    pvVar14 = kernel->data;
    pvVar37 = (void *)(local_a8._16_8_ * local_68 * uVar39 + local_a8._0_8_);
    for (uVar22 = 0; uVar22 != uVar20; uVar22 = uVar22 + 1) {
      lVar34 = uVar22 * 9;
      cVar1 = *(char *)((long)pvVar14 + lVar34 + iVar19);
      cVar2 = *(char *)((long)pvVar14 + lVar34 + (long)iVar19 + 1);
      cVar3 = *(char *)((long)pvVar14 + lVar34 + (long)iVar19 + 2);
      cVar4 = *(char *)((long)pvVar14 + lVar34 + (long)iVar19 + 3);
      cVar5 = *(char *)((long)pvVar14 + lVar34 + (long)iVar19 + 4);
      cVar6 = *(char *)((long)pvVar14 + lVar34 + (long)iVar19 + 5);
      cVar7 = *(char *)((long)pvVar14 + lVar34 + (long)iVar19 + 6);
      cVar8 = *(char *)((long)pvVar14 + lVar34 + (long)iVar19 + 7);
      cVar9 = *(char *)((long)pvVar14 + lVar34 + (long)iVar19 + 8);
      for (lVar34 = 4; lVar34 != 0x28; lVar34 = lVar34 + 6) {
        sVar10 = *(short *)(&UNK_004c88cc + lVar34);
        sVar11 = *(short *)(&UNK_004c88ce + lVar34);
        sVar12 = *(short *)((long)&DAT_004c88d0 + lVar34);
        *(short *)((long)asStack_5c + lVar34) = sVar12 * cVar3 + sVar11 * cVar2 + sVar10 * cVar1;
        *(short *)((long)asStack_5c + lVar34 + 2) = sVar12 * cVar6 + sVar11 * cVar5 + sVar10 * cVar4
        ;
        *(short *)((long)tmp[0] + lVar34) = sVar12 * cVar9 + sVar11 * cVar8 + sVar10 * cVar7;
      }
      pvVar23 = pvVar37;
      for (lVar34 = 0; lVar34 != 6; lVar34 = lVar34 + 1) {
        sVar10 = tmp[lVar34][0];
        uVar13 = *(uint *)(tmp[lVar34] + 1);
        puVar29 = &DAT_004c88d2;
        for (lVar35 = 0; lVar35 != 6; lVar35 = lVar35 + 1) {
          auVar17 = vpmullw_avx(ZEXT416(*puVar29),ZEXT416(uVar13));
          uVar31 = vpextrw_avx(auVar17,1);
          *(short *)((long)pvVar23 + lVar35 * 2) =
               (short)uVar31 + auVar17._0_2_ + *(short *)((long)puVar29 + -2) * sVar10;
          puVar29 = (uint *)((long)puVar29 + 6);
        }
        pvVar23 = (void *)((long)pvVar23 + 0xc);
      }
      pvVar37 = (void *)((long)pvVar37 + (long)(int)local_a8._44_4_ * local_a8._16_8_);
    }
  }
  Mat::create(kernel_tm,inch / 8,0x24,outch / 4,0x40,0x20,(Allocator *)0x0);
  lVar32 = local_68 * local_a8._16_8_;
  iVar19 = kernel_tm->w;
  pvVar14 = kernel_tm->data;
  sVar15 = kernel_tm->elemsize;
  sVar16 = kernel_tm->cstep;
  pvVar40 = (void *)(lVar32 * 3 + local_a8._0_8_);
  lVar34 = lVar32 * 4;
  lVar35 = (long)(int)local_a8._44_4_ * local_a8._16_8_ * 8;
  pvVar23 = (void *)(lVar32 * 2 + local_a8._0_8_);
  pvVar33 = (void *)(lVar32 + local_a8._0_8_);
  pvVar37 = (void *)local_a8._0_8_;
  for (uVar20 = 0; (long)(uVar20 | 3) < (long)outch; uVar20 = uVar20 + 4) {
    pvVar25 = pvVar33;
    pvVar26 = pvVar23;
    pvVar28 = pvVar37;
    pvVar41 = pvVar40;
    for (lVar32 = 0; lVar32 != 0x24; lVar32 = lVar32 + 1) {
      lVar30 = (long)pvVar14 + (long)iVar19 * sVar15 * lVar32 + (uVar20 >> 2) * sVar16 * sVar15;
      pvVar24 = pvVar25;
      pvVar27 = pvVar28;
      pvVar38 = pvVar41;
      pvVar43 = pvVar26;
      for (uVar39 = 0; (long)(uVar39 | 7) < (long)inch; uVar39 = uVar39 + 8) {
        lVar36 = 0;
        for (lVar42 = 0; lVar42 != 0x40; lVar42 = lVar42 + 8) {
          *(undefined2 *)(lVar30 + lVar42) = *(undefined2 *)((long)pvVar27 + lVar36);
          *(undefined2 *)(lVar30 + lVar42 + 2) = *(undefined2 *)((long)pvVar24 + lVar36);
          *(undefined2 *)(lVar30 + lVar42 + 4) = *(undefined2 *)((long)pvVar43 + lVar36);
          *(undefined2 *)(lVar30 + lVar42 + 6) = *(undefined2 *)((long)pvVar38 + lVar36);
          lVar36 = lVar36 + (long)(int)local_a8._44_4_ * local_a8._16_8_;
        }
        pvVar38 = (void *)((long)pvVar38 + lVar35);
        pvVar43 = (void *)((long)pvVar43 + lVar35);
        pvVar24 = (void *)((long)pvVar24 + lVar35);
        pvVar27 = (void *)((long)pvVar27 + lVar35);
        lVar30 = lVar30 + 0x40;
      }
      pvVar41 = (void *)((long)pvVar41 + 2);
      pvVar26 = (void *)((long)pvVar26 + 2);
      pvVar25 = (void *)((long)pvVar25 + 2);
      pvVar28 = (void *)((long)pvVar28 + 2);
    }
    pvVar40 = (void *)((long)pvVar40 + lVar34);
    pvVar23 = (void *)((long)pvVar23 + lVar34);
    pvVar33 = (void *)((long)pvVar33 + lVar34);
    pvVar37 = (void *)((long)pvVar37 + lVar34);
  }
  piVar18 = (int *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if ((Allocator *)local_a8._32_8_ == (Allocator *)0x0) {
        free((void *)local_a8._0_8_);
      }
      else {
        (*(*(_func_int ***)local_a8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avx2(const Mat& kernel, Mat& kernel_tm, int inch, int outch, const Option& opt)
{
    conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse(kernel, kernel_tm, inch, outch, opt);
}